

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParseDocument(xmlParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlParserCtxtPtr)0x0) || (ctxt->input == (xmlParserInputPtr)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    if (((ctxt->input->flags & 0x40U) == 0) &&
       ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    xmlCtxtInitializeLate(ctxt);
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (ctxt->sax->setDocumentLocator != (setDocumentLocatorSAXFunc)0x0)) {
      (*ctxt->sax->setDocumentLocator)(ctxt->userData,&xmlDefaultSAXLocator);
    }
    xmlDetectEncoding(ctxt);
    if (*ctxt->input->cur == '\0') {
      xmlFatalErr(ctxt,XML_ERR_DOCUMENT_EMPTY,(char *)0x0);
      ctxt_local._4_4_ = -1;
    }
    else {
      if (((ctxt->input->flags & 0x40U) == 0) &&
         ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
      if (((((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '?')) &&
           (ctxt->input->cur[2] == 'x')) &&
          ((ctxt->input->cur[3] == 'm' && (ctxt->input->cur[4] == 'l')))) &&
         (((ctxt->input->cur[5] == ' ' || ((8 < ctxt->input->cur[5] && (ctxt->input->cur[5] < 0xb)))
           ) || (ctxt->input->cur[5] == '\r')))) {
        xmlParseXMLDecl(ctxt);
        xmlSkipBlankChars(ctxt);
      }
      else {
        pxVar1 = xmlCharStrdup("1.0");
        ctxt->version = pxVar1;
        if (ctxt->version == (xmlChar *)0x0) {
          xmlErrMemory(ctxt);
          return -1;
        }
      }
      if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
          (ctxt->sax->startDocument != (startDocumentSAXFunc)0x0)) && (ctxt->disableSAX == 0)) {
        (*ctxt->sax->startDocument)(ctxt->userData);
      }
      if (((ctxt->myDoc != (xmlDocPtr)0x0) && (ctxt->input != (xmlParserInputPtr)0x0)) &&
         ((ctxt->input->buf != (xmlParserInputBufferPtr)0x0 && (-1 < ctxt->input->buf->compressed)))
         ) {
        ctxt->myDoc->compression = ctxt->input->buf->compressed;
      }
      xmlParseMisc(ctxt);
      if (((ctxt->input->flags & 0x40U) == 0) &&
         ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
      if ((((((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '!')) &&
            (ctxt->input->cur[2] == 'D')) &&
           ((ctxt->input->cur[3] == 'O' && (ctxt->input->cur[4] == 'C')))) &&
          ((ctxt->input->cur[5] == 'T' &&
           ((ctxt->input->cur[6] == 'Y' && (ctxt->input->cur[7] == 'P')))))) &&
         (ctxt->input->cur[8] == 'E')) {
        ctxt->inSubset = 1;
        xmlParseDocTypeDecl(ctxt);
        if (*ctxt->input->cur == '[') {
          xmlParseInternalSubset(ctxt);
        }
        else if (*ctxt->input->cur == '>') {
          xmlNextChar(ctxt);
        }
        ctxt->inSubset = 2;
        if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
            (ctxt->sax->externalSubset != (externalSubsetSAXFunc)0x0)) && (ctxt->disableSAX == 0)) {
          (*ctxt->sax->externalSubset)
                    (ctxt->userData,ctxt->intSubName,ctxt->extSubSystem,ctxt->extSubURI);
        }
        ctxt->inSubset = 0;
        xmlCleanSpecialAttr(ctxt);
        xmlParseMisc(ctxt);
      }
      if (((ctxt->input->flags & 0x40U) == 0) &&
         ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
      if (*ctxt->input->cur == '<') {
        xmlParseElement(ctxt);
        xmlParseMisc(ctxt);
        xmlParserCheckEOF(ctxt,XML_ERR_DOCUMENT_END);
      }
      else if (ctxt->wellFormed != 0) {
        xmlFatalErrMsg(ctxt,XML_ERR_DOCUMENT_EMPTY,"Start tag expected, \'<\' not found\n");
      }
      ctxt->instate = XML_PARSER_EOF;
      xmlFinishDocument(ctxt);
      if (ctxt->wellFormed == 0) {
        ctxt->valid = 0;
        ctxt_local._4_4_ = -1;
      }
      else {
        ctxt_local._4_4_ = 0;
      }
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlParseDocument(xmlParserCtxtPtr ctxt) {
    if ((ctxt == NULL) || (ctxt->input == NULL))
        return(-1);

    GROW;

    /*
     * SAX: detecting the level.
     */
    xmlCtxtInitializeLate(ctxt);

    if ((ctxt->sax) && (ctxt->sax->setDocumentLocator)) {
        ctxt->sax->setDocumentLocator(ctxt->userData,
                (xmlSAXLocator *) &xmlDefaultSAXLocator);
    }

    xmlDetectEncoding(ctxt);

    if (CUR == 0) {
	xmlFatalErr(ctxt, XML_ERR_DOCUMENT_EMPTY, NULL);
	return(-1);
    }

    GROW;
    if ((CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) && (IS_BLANK_CH(NXT(5)))) {

	/*
	 * Note that we will switch encoding on the fly.
	 */
	xmlParseXMLDecl(ctxt);
	SKIP_BLANKS;
    } else {
	ctxt->version = xmlCharStrdup(XML_DEFAULT_VERSION);
        if (ctxt->version == NULL) {
            xmlErrMemory(ctxt);
            return(-1);
        }
    }
    if ((ctxt->sax) && (ctxt->sax->startDocument) && (!ctxt->disableSAX))
        ctxt->sax->startDocument(ctxt->userData);
    if ((ctxt->myDoc != NULL) && (ctxt->input != NULL) &&
        (ctxt->input->buf != NULL) && (ctxt->input->buf->compressed >= 0)) {
	ctxt->myDoc->compression = ctxt->input->buf->compressed;
    }

    /*
     * The Misc part of the Prolog
     */
    xmlParseMisc(ctxt);

    /*
     * Then possibly doc type declaration(s) and more Misc
     * (doctypedecl Misc*)?
     */
    GROW;
    if (CMP9(CUR_PTR, '<', '!', 'D', 'O', 'C', 'T', 'Y', 'P', 'E')) {

	ctxt->inSubset = 1;
	xmlParseDocTypeDecl(ctxt);
	if (RAW == '[') {
	    xmlParseInternalSubset(ctxt);
	} else if (RAW == '>') {
            NEXT;
        }

	/*
	 * Create and update the external subset.
	 */
	ctxt->inSubset = 2;
	if ((ctxt->sax != NULL) && (ctxt->sax->externalSubset != NULL) &&
	    (!ctxt->disableSAX))
	    ctxt->sax->externalSubset(ctxt->userData, ctxt->intSubName,
	                              ctxt->extSubSystem, ctxt->extSubURI);
	ctxt->inSubset = 0;

        xmlCleanSpecialAttr(ctxt);

	xmlParseMisc(ctxt);
    }

    /*
     * Time to start parsing the tree itself
     */
    GROW;
    if (RAW != '<') {
        if (ctxt->wellFormed)
            xmlFatalErrMsg(ctxt, XML_ERR_DOCUMENT_EMPTY,
                           "Start tag expected, '<' not found\n");
    } else {
	xmlParseElement(ctxt);

	/*
	 * The Misc part at the end
	 */
	xmlParseMisc(ctxt);

        xmlParserCheckEOF(ctxt, XML_ERR_DOCUMENT_END);
    }

    ctxt->instate = XML_PARSER_EOF;
    xmlFinishDocument(ctxt);

    if (! ctxt->wellFormed) {
	ctxt->valid = 0;
	return(-1);
    }

    return(0);
}